

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawDoubleSky1PalCommand::Execute(DrawDoubleSky1PalCommand *this,DrawerThread *thread)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  byte *pbVar20;
  int iVar21;
  byte bVar22;
  bool bVar23;
  
  puVar8 = (this->super_PalSkyCommand)._dest;
  iVar2 = (this->super_PalSkyCommand)._pitch;
  puVar9 = (this->super_PalSkyCommand)._source[0];
  puVar10 = (this->super_PalSkyCommand)._source2[0];
  iVar3 = (this->super_PalSkyCommand)._sourceheight[0];
  iVar12 = (this->super_PalSkyCommand)._sourceheight[1];
  uVar4 = (this->super_PalSkyCommand)._texturefrac[0];
  uVar5 = (this->super_PalSkyCommand)._iscale[0];
  uVar6 = *(uint *)&(this->super_PalSkyCommand).super_DrawerCommand.field_0xc;
  uVar7 = (this->super_PalSkyCommand).solid_bottom;
  iVar11 = DrawerThread::count_for_thread
                     (thread,(this->super_PalSkyCommand).super_DrawerCommand._dest_y,
                      (this->super_PalSkyCommand)._count);
  if (0 < iVar11) {
    uVar1 = iVar12 - 1;
    iVar12 = DrawerThread::skipped_by_thread
                       (thread,(this->super_PalSkyCommand).super_DrawerCommand._dest_y);
    iVar13 = DrawerThread::skipped_by_thread
                       (thread,(this->super_PalSkyCommand).super_DrawerCommand._dest_y);
    pbVar20 = puVar8 + iVar13 * iVar2;
    uVar14 = iVar12 * uVar5 + uVar4;
    iVar12 = thread->num_cores;
    iVar21 = uVar5 * iVar12;
    iVar13 = 0x2000000 - uVar14;
    while (bVar23 = iVar11 != 0, iVar11 = iVar11 + -1, bVar23) {
      uVar15 = (uVar14 >> 8 & 0xffff) * iVar3 >> 0x10;
      bVar22 = puVar9[uVar15];
      if (bVar22 == 0) {
        if (uVar1 <= uVar15) {
          uVar15 = uVar1;
        }
        bVar22 = puVar10[uVar15];
      }
      iVar18 = (int)uVar14 >> 0xe;
      iVar17 = iVar13 >> 0xe;
      if ((iVar18 < 0x100) || (iVar17 < 0x100)) {
        if (0xff < iVar17) {
          iVar17 = 0x100;
        }
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        if (0xff < iVar18) {
          iVar18 = 0x100;
        }
        if (iVar18 < 1) {
          iVar18 = 0;
        }
        iVar16 = 0x100 - iVar18;
        iVar19 = 0x100 - iVar17;
        bVar22 = RGB32k.All
                 [(ulong)(iVar19 * (uVar7 & 0xff) +
                          (iVar16 * (uVar6 & 0xff) +
                           (uint)GPalette.BaseColors[bVar22].field_0.field_0.b * iVar18 >> 8) *
                          iVar17 >> 0xb) +
                  (ulong)(iVar19 * (uVar7 >> 8 & 0xff) +
                          (iVar16 * (uVar6 >> 8 & 0xff) +
                           (uint)GPalette.BaseColors[bVar22].field_0.field_0.g * iVar18 >> 8) *
                          iVar17 >> 6 & 0xffffffe0) +
                  (ulong)(iVar19 * (uVar7 >> 0x10 & 0xff) +
                          (iVar16 * (uVar6 >> 0x10 & 0xff) +
                           (uint)GPalette.BaseColors[bVar22].field_0.field_0.r * iVar18 >> 8) *
                          iVar17 >> 1 & 0x7fc00)];
      }
      *pbVar20 = bVar22;
      uVar14 = uVar14 + iVar21;
      pbVar20 = pbVar20 + iVar12 * iVar2;
      iVar13 = iVar13 - iVar21;
    }
  }
  return;
}

Assistant:

void DrawDoubleSky1PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int pitch = _pitch;
		const uint8_t *source0 = _source[0];
		const uint8_t *source1 = _source2[0];
		int textureheight0 = _sourceheight[0];
		uint32_t maxtextureheight1 = _sourceheight[1] - 1;

		int32_t frac = _texturefrac[0];
		int32_t fracstep = _iscale[0];

		int start_fade = 2; // How fast it should fade out

		int solid_top_r = RPART(solid_top);
		int solid_top_g = GPART(solid_top);
		int solid_top_b = BPART(solid_top);
		int solid_bottom_r = RPART(solid_bottom);
		int solid_bottom_g = GPART(solid_bottom);
		int solid_bottom_b = BPART(solid_bottom);

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * skipped;
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		for (int index = 0; index < count; index++)
		{
			uint32_t sample_index = (((((uint32_t)frac) << 8) >> FRACBITS) * textureheight0) >> FRACBITS;
			uint8_t fg = source0[sample_index];
			if (fg == 0)
			{
				uint32_t sample_index2 = MIN(sample_index, maxtextureheight1);
				fg = source1[sample_index2];
			}

			int alpha_top = MAX(MIN(frac >> (16 - start_fade), 256), 0);
			int alpha_bottom = MAX(MIN(((2 << 24) - frac) >> (16 - start_fade), 256), 0);

			if (alpha_top == 256 && alpha_bottom == 256)
			{
				*dest = fg;
			}
			else
			{
				int inv_alpha_top = 256 - alpha_top;
				int inv_alpha_bottom = 256 - alpha_bottom;

				const auto &c = GPalette.BaseColors[fg];
				int c_red = c.r;
				int c_green = c.g;
				int c_blue = c.b;
				c_red = (c_red * alpha_top + solid_top_r * inv_alpha_top) >> 8;
				c_green = (c_green * alpha_top + solid_top_g * inv_alpha_top) >> 8;
				c_blue = (c_blue * alpha_top + solid_top_b * inv_alpha_top) >> 8;
				c_red = (c_red * alpha_bottom + solid_bottom_r * inv_alpha_bottom) >> 8;
				c_green = (c_green * alpha_bottom + solid_bottom_g * inv_alpha_bottom) >> 8;
				c_blue = (c_blue * alpha_bottom + solid_bottom_b * inv_alpha_bottom) >> 8;
				*dest = RGB32k.RGB[(c_red >> 3)][(c_green >> 3)][(c_blue >> 3)];
			}

			frac += fracstep;
			dest += pitch;
		}
	}